

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O2

ON_3dPoint * __thiscall
ON_HermiteSurface::PointAt(ON_3dPoint *__return_storage_ptr__,ON_HermiteSurface *this,int u,int v)

{
  ON_3dPoint *pOVar1;
  double dVar2;
  
  __return_storage_ptr__->z = ON_3dPoint::UnsetPoint.z;
  dVar2 = ON_3dPoint::UnsetPoint.y;
  __return_storage_ptr__->x = ON_3dPoint::UnsetPoint.x;
  __return_storage_ptr__->y = dVar2;
  if ((((-1 < u) && (-1 < v)) && (u < this->m_u_count)) && (v < this->m_v_count)) {
    pOVar1 = (this->m_grid_points).m_a[(uint)u].m_a;
    __return_storage_ptr__->z = pOVar1[(uint)v].z;
    pOVar1 = pOVar1 + (uint)v;
    dVar2 = pOVar1->y;
    __return_storage_ptr__->x = pOVar1->x;
    __return_storage_ptr__->y = dVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

ON_3dPoint ON_HermiteSurface::PointAt(int u, int v) const
{
  ON_3dPoint rc = ON_3dPoint::UnsetPoint;
  if (InBounds(u, v))
    rc = m_grid_points[u][v];
  return rc;
}